

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# raw_hash_set.h
# Opt level: O2

iterator __thiscall
absl::lts_20250127::container_internal::
raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
::find_non_soo<std::basic_string_view<char,std::char_traits<char>>>
          (raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>
           *this,key_arg<std::basic_string_view<char>_> *key,size_t hash)

{
  char *pcVar1;
  long lVar2;
  undefined1 auVar3 [16];
  bool bVar4;
  uint32_t uVar5;
  ulong extraout_RDX;
  ushort x;
  undefined4 uVar6;
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  __m128i match;
  char cVar9;
  char cVar11;
  char cVar12;
  char cVar13;
  char cVar14;
  char cVar15;
  char cVar16;
  char cVar17;
  char cVar18;
  char cVar19;
  char cVar20;
  char cVar21;
  char cVar22;
  char cVar23;
  char cVar24;
  char cVar25;
  undefined1 auVar10 [16];
  iterator iVar26;
  probe_seq<16UL> seq;
  probe_seq<16UL> local_80;
  EqualElement<std::basic_string_view<char,_std::char_traits<char>_>_> local_68;
  char local_58;
  char cStack_57;
  char cStack_56;
  char cStack_55;
  char cStack_54;
  char cStack_53;
  char cStack_52;
  char cStack_51;
  char cStack_50;
  char cStack_4f;
  char cStack_4e;
  char cStack_4d;
  char cStack_4c;
  char cStack_4b;
  char cStack_4a;
  char cStack_49;
  undefined1 local_48 [16];
  
  probe(&local_80,(CommonFields *)this,hash);
  lVar2 = *(long *)(this + 0x10);
  auVar7 = ZEXT216(CONCAT11((char)hash,(char)hash) & 0x7f7f);
  auVar7 = pshuflw(auVar7,auVar7,0);
  uVar6 = auVar7._0_4_;
  auVar7._4_4_ = uVar6;
  auVar7._0_4_ = uVar6;
  auVar7._8_4_ = uVar6;
  auVar7._12_4_ = uVar6;
  while( true ) {
    pcVar1 = (char *)(lVar2 + local_80.offset_);
    auVar8[0] = -(auVar7[0] == *pcVar1);
    auVar8[1] = -(auVar7[1] == pcVar1[1]);
    auVar8[2] = -(auVar7[2] == pcVar1[2]);
    auVar8[3] = -(auVar7[3] == pcVar1[3]);
    auVar8[4] = -(auVar7[4] == pcVar1[4]);
    auVar8[5] = -(auVar7[5] == pcVar1[5]);
    auVar8[6] = -(auVar7[6] == pcVar1[6]);
    auVar8[7] = -(auVar7[7] == pcVar1[7]);
    auVar8[8] = -(auVar7[8] == pcVar1[8]);
    auVar8[9] = -(auVar7[9] == pcVar1[9]);
    auVar8[10] = -(auVar7[10] == pcVar1[10]);
    auVar8[0xb] = -(auVar7[0xb] == pcVar1[0xb]);
    auVar8[0xc] = -(auVar7[0xc] == pcVar1[0xc]);
    auVar8[0xd] = -(auVar7[0xd] == pcVar1[0xd]);
    auVar8[0xe] = -(auVar7[0xe] == pcVar1[0xe]);
    auVar8[0xf] = -(auVar7[0xf] == pcVar1[0xf]);
    cVar9 = *pcVar1;
    cVar11 = pcVar1[1];
    cVar12 = pcVar1[2];
    cVar13 = pcVar1[3];
    cVar14 = pcVar1[4];
    cVar15 = pcVar1[5];
    cVar16 = pcVar1[6];
    cVar17 = pcVar1[7];
    cVar18 = pcVar1[8];
    cVar19 = pcVar1[9];
    cVar20 = pcVar1[10];
    cVar21 = pcVar1[0xb];
    cVar22 = pcVar1[0xc];
    cVar23 = pcVar1[0xd];
    cVar24 = pcVar1[0xe];
    cVar25 = pcVar1[0xf];
    for (x = (ushort)(SUB161(auVar8 >> 7,0) & 1) | (ushort)(SUB161(auVar8 >> 0xf,0) & 1) << 1 |
             (ushort)(SUB161(auVar8 >> 0x17,0) & 1) << 2 |
             (ushort)(SUB161(auVar8 >> 0x1f,0) & 1) << 3 |
             (ushort)(SUB161(auVar8 >> 0x27,0) & 1) << 4 |
             (ushort)(SUB161(auVar8 >> 0x2f,0) & 1) << 5 |
             (ushort)(SUB161(auVar8 >> 0x37,0) & 1) << 6 |
             (ushort)(SUB161(auVar8 >> 0x3f,0) & 1) << 7 |
             (ushort)(SUB161(auVar8 >> 0x47,0) & 1) << 8 |
             (ushort)(SUB161(auVar8 >> 0x4f,0) & 1) << 9 |
             (ushort)(SUB161(auVar8 >> 0x57,0) & 1) << 10 |
             (ushort)(SUB161(auVar8 >> 0x5f,0) & 1) << 0xb |
             (ushort)(SUB161(auVar8 >> 0x67,0) & 1) << 0xc |
             (ushort)(SUB161(auVar8 >> 0x6f,0) & 1) << 0xd |
             (ushort)(SUB161(auVar8 >> 0x77,0) & 1) << 0xe | (ushort)(auVar8[0xf] >> 7) << 0xf;
        x != 0; x = x - 1 & x) {
      local_58 = cVar9;
      cStack_57 = cVar11;
      cStack_56 = cVar12;
      cStack_55 = cVar13;
      cStack_54 = cVar14;
      cStack_53 = cVar15;
      cStack_52 = cVar16;
      cStack_51 = cVar17;
      cStack_50 = cVar18;
      cStack_4f = cVar19;
      cStack_4e = cVar20;
      cStack_4d = cVar21;
      cStack_4c = cVar22;
      cStack_4b = cVar23;
      cStack_4a = cVar24;
      cStack_49 = cVar25;
      local_48 = auVar7;
      uVar5 = TrailingZeros<unsigned_short>(x);
      local_68.rhs = key;
      local_68.eq = (key_equal *)this;
      bVar4 = DecomposePair<absl::lts_20250127::container_internal::raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::string,google::protobuf::Descriptor::WellKnownType>,absl::lts_20250127::container_internal::StringHash,absl::lts_20250127::container_internal::StringEq,std::allocator<std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>>>::EqualElement<std::basic_string_view<char,std::char_traits<char>>>,std::pair<std::__cxx11::string_const,google::protobuf::Descriptor::WellKnownType>&>
                        (&local_68,
                         (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>
                          *)((local_80.offset_ + uVar5 & local_80.mask_) * 0x28 +
                            *(long *)(this + 0x18)));
      if (bVar4) {
        iVar26 = raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
                 ::iterator_at((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
                                *)this,uVar5 + local_80.offset_ & local_80.mask_);
        return iVar26;
      }
      auVar7 = local_48;
      cVar9 = local_58;
      cVar11 = cStack_57;
      cVar12 = cStack_56;
      cVar13 = cStack_55;
      cVar14 = cStack_54;
      cVar15 = cStack_53;
      cVar16 = cStack_52;
      cVar17 = cStack_51;
      cVar18 = cStack_50;
      cVar19 = cStack_4f;
      cVar20 = cStack_4e;
      cVar21 = cStack_4d;
      cVar22 = cStack_4c;
      cVar23 = cStack_4b;
      cVar24 = cStack_4a;
      cVar25 = cStack_49;
    }
    auVar10[0] = -(cVar9 == -0x80);
    auVar10[1] = -(cVar11 == -0x80);
    auVar10[2] = -(cVar12 == -0x80);
    auVar10[3] = -(cVar13 == -0x80);
    auVar10[4] = -(cVar14 == -0x80);
    auVar10[5] = -(cVar15 == -0x80);
    auVar10[6] = -(cVar16 == -0x80);
    auVar10[7] = -(cVar17 == -0x80);
    auVar10[8] = -(cVar18 == -0x80);
    auVar10[9] = -(cVar19 == -0x80);
    auVar10[10] = -(cVar20 == -0x80);
    auVar10[0xb] = -(cVar21 == -0x80);
    auVar10[0xc] = -(cVar22 == -0x80);
    auVar10[0xd] = -(cVar23 == -0x80);
    auVar10[0xe] = -(cVar24 == -0x80);
    auVar10[0xf] = -(cVar25 == -0x80);
    if ((((((((((((((((auVar10 >> 7 & (undefined1  [16])0x1) != (undefined1  [16])0x0 ||
                     (auVar10 >> 0xf & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                    (auVar10 >> 0x17 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                   (auVar10 >> 0x1f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                  (auVar10 >> 0x27 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                 (auVar10 >> 0x2f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
                (auVar10 >> 0x37 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
               (auVar10 >> 0x3f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
              (auVar10 >> 0x47 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
             (auVar10 >> 0x4f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
            (auVar10 >> 0x57 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
           (auVar10 >> 0x5f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
          (auVar10 >> 0x67 & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
         (auVar10 >> 0x6f & (undefined1  [16])0x1) != (undefined1  [16])0x0) ||
        (auVar10 >> 0x77 & (undefined1  [16])0x1) != (undefined1  [16])0x0) || cVar25 == -0x80)
    break;
    local_80.index_ = local_80.index_ + 0x10;
    local_80.offset_ = local_80.offset_ + local_80.index_ & local_80.mask_;
    if (*(ulong *)this < local_80.index_) {
      __assert_fail("(seq.index() <= capacity() && \"full table!\") && \"Try enabling sanitizers.\""
                    ,
                    "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/build_O2/_deps/absl-src/absl/container/internal/raw_hash_set.h"
                    ,0xe37,
                    "iterator absl::container_internal::raw_hash_set<absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>, absl::container_internal::StringHash, absl::container_internal::StringEq, std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>>::find_non_soo(const key_arg<K> &, size_t) [Policy = absl::container_internal::FlatHashMapPolicy<std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>, Hash = absl::container_internal::StringHash, Eq = absl::container_internal::StringEq, Alloc = std::allocator<std::pair<const std::basic_string<char>, google::protobuf::Descriptor::WellKnownType>>, K = std::basic_string_view<char>]"
                   );
    }
  }
  raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
  ::AssertNotDebugCapacity
            ((raw_hash_set<absl::lts_20250127::container_internal::FlatHashMapPolicy<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>,_absl::lts_20250127::container_internal::StringHash,_absl::lts_20250127::container_internal::StringEq,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_google::protobuf::Descriptor::WellKnownType>_>_>
              *)this);
  auVar3._8_8_ = 0;
  auVar3._0_8_ = extraout_RDX;
  return (iterator)(auVar3 << 0x40);
}

Assistant:

iterator find_non_soo(const key_arg<K>& key, size_t hash) {
    ABSL_SWISSTABLE_ASSERT(!is_soo());
    auto seq = probe(common(), hash);
    const ctrl_t* ctrl = control();
    while (true) {
      Group g{ctrl + seq.offset()};
      for (uint32_t i : g.Match(H2(hash))) {
        if (ABSL_PREDICT_TRUE(PolicyTraits::apply(
                EqualElement<K>{key, eq_ref()},
                PolicyTraits::element(slot_array() + seq.offset(i)))))
          return iterator_at(seq.offset(i));
      }
      if (ABSL_PREDICT_TRUE(g.MaskEmpty())) return end();
      seq.next();
      ABSL_SWISSTABLE_ASSERT(seq.index() <= capacity() && "full table!");
    }
  }